

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O1

tbx_t * tbx_index(BGZF *fp,int min_shift,tbx_conf_t *conf)

{
  char cVar1;
  int n_lvls;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  khint_t kVar8;
  tbx_t *tbx;
  char *pcVar9;
  hts_idx_t *phVar10;
  kh_s2i_t *pkVar11;
  bool bVar12;
  uint64_t offset0;
  long lVar13;
  tbx_intv_t intv;
  int local_a0;
  int local_9c;
  int local_7c;
  kstring_t local_78;
  tbx_intv_t local_58;
  
  tbx = (tbx_t *)calloc(1,0x28);
  local_78.l = 0;
  local_78.m = 0;
  local_78.s = (char *)0x0;
  iVar2 = conf->line_skip;
  (tbx->conf).meta_char = conf->meta_char;
  (tbx->conf).line_skip = iVar2;
  iVar2 = conf->sc;
  iVar3 = conf->bc;
  iVar4 = conf->ec;
  (tbx->conf).preset = conf->preset;
  (tbx->conf).sc = iVar2;
  (tbx->conf).bc = iVar3;
  (tbx->conf).ec = iVar4;
  if (min_shift < 1) {
    local_a0 = 2;
    n_lvls = 5;
    local_9c = 0xe;
  }
  else {
    n_lvls = (0x21 - min_shift) / 3;
    local_a0 = 0;
    local_9c = min_shift;
  }
  bVar12 = true;
  lVar13 = 0;
  offset0 = 0;
  while (iVar6 = bgzf_getline(fp,10,&local_78), -1 < iVar6) {
    iVar6 = (tbx->conf).line_skip;
    while ((lVar13 < iVar6 || ((tbx->conf).meta_char == (int)*local_78.s))) {
      offset0 = (ulong)(ushort)fp->block_offset | fp->block_address << 0x10;
      iVar7 = bgzf_getline(fp,10,&local_78);
      lVar13 = lVar13 + 1;
      if (iVar7 < 0) goto LAB_00137d25;
    }
    if (bVar12) {
      phVar10 = hts_idx_init(0,local_a0,offset0,local_9c,n_lvls);
      tbx->idx = phVar10;
    }
    iVar6 = tbx_parse1((tbx_conf_t *)tbx,(int)local_78.l,local_78.s,&local_58);
    pcVar5 = local_58.se;
    pcVar9 = local_58.ss;
    if (iVar6 == 0) {
      cVar1 = *local_58.se;
      *local_58.se = '\0';
      if (tbx->dict == (void *)0x0) {
        pkVar11 = kh_init_s2i();
        tbx->dict = pkVar11;
      }
      pkVar11 = (kh_s2i_t *)tbx->dict;
      kVar8 = kh_put_s2i(pkVar11,pcVar9,&local_7c);
      if (local_7c != 0) {
        pcVar9 = strdup(pcVar9);
        pkVar11->keys[kVar8] = pcVar9;
        pkVar11->vals[kVar8] = (ulong)(pkVar11->size - 1);
      }
      local_58.tid = -1;
      if (kVar8 != pkVar11->n_buckets) {
        local_58.tid = (int)pkVar11->vals[kVar8];
      }
      *pcVar5 = cVar1;
    }
    else {
      tbx_index_cold_1();
    }
    lVar13 = lVar13 + 1;
    iVar6 = hts_idx_push(tbx->idx,local_58.tid,(int)local_58.beg,(int)local_58.end,
                         (ulong)(ushort)fp->block_offset | fp->block_address << 0x10,1);
    bVar12 = false;
    if (iVar6 < 0) {
      free(local_78.s);
      tbx_destroy(tbx);
      return (tbx_t *)0x0;
    }
  }
LAB_00137d25:
  if (tbx->idx == (hts_idx_t *)0x0) {
    phVar10 = hts_idx_init(0,local_a0,offset0,local_9c,n_lvls);
    tbx->idx = phVar10;
  }
  if (tbx->dict == (void *)0x0) {
    pkVar11 = kh_init_s2i();
    tbx->dict = pkVar11;
  }
  hts_idx_finish(tbx->idx,(ulong)(ushort)fp->block_offset | fp->block_address << 0x10);
  tbx_set_meta(tbx);
  free(local_78.s);
  return tbx;
}

Assistant:

tbx_t *tbx_index(BGZF *fp, int min_shift, const tbx_conf_t *conf)
{
    tbx_t *tbx;
    kstring_t str;
    int ret, first = 0, n_lvls, fmt;
    int64_t lineno = 0;
    uint64_t last_off = 0;
    tbx_intv_t intv;

    str.s = 0; str.l = str.m = 0;
    tbx = (tbx_t*)calloc(1, sizeof(tbx_t));
    tbx->conf = *conf;
    if (min_shift > 0) n_lvls = (TBX_MAX_SHIFT - min_shift + 2) / 3, fmt = HTS_FMT_CSI;
    else min_shift = 14, n_lvls = 5, fmt = HTS_FMT_TBI;
    while ((ret = bgzf_getline(fp, '\n', &str)) >= 0) {
        ++lineno;
        if (lineno <= tbx->conf.line_skip || str.s[0] == tbx->conf.meta_char) {
            last_off = bgzf_tell(fp);
            continue;
        }
        if (first == 0) {
            tbx->idx = hts_idx_init(0, fmt, last_off, min_shift, n_lvls);
            first = 1;
        }
        get_intv(tbx, &str, &intv, 1);
        ret = hts_idx_push(tbx->idx, intv.tid, intv.beg, intv.end, bgzf_tell(fp), 1);
        if (ret < 0)
        {
            free(str.s);
            tbx_destroy(tbx);
            return NULL;
        }
    }
    if ( !tbx->idx ) tbx->idx = hts_idx_init(0, fmt, last_off, min_shift, n_lvls);   // empty file
    if ( !tbx->dict ) tbx->dict = kh_init(s2i);
    hts_idx_finish(tbx->idx, bgzf_tell(fp));
    tbx_set_meta(tbx);
    free(str.s);
    return tbx;
}